

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_send(telnet_t *telnet,char *buffer,size_t size)

{
  char *buffer_00;
  size_t size_00;
  long lVar1;
  
  lVar1 = 0;
  do {
    buffer_00 = buffer + lVar1;
    size_00 = 0;
    while( true ) {
      if ((lVar1 - size) + size_00 == 0) {
        if (size - lVar1 == 0) {
          return;
        }
        _send(telnet,buffer_00,size - lVar1);
        return;
      }
      if (buffer_00[size_00] == -1) break;
      size_00 = size_00 + 1;
    }
    if (size_00 != 0) {
      _send(telnet,buffer_00,size_00);
    }
    lVar1 = lVar1 + size_00 + 1;
    telnet_iac(telnet,0xff);
  } while( true );
}

Assistant:

void telnet_send(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}